

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

void __thiscall
gl4cts::EnhancedLayouts::XFBCaptureUnsizedArrayTest::testInit(XFBCaptureUnsizedArrayTest *this)

{
  iterator __position;
  undefined8 in_RAX;
  GLuint stage;
  STAGES SVar1;
  testCase test_case;
  undefined8 uStack_28;
  
  SVar1 = COMPUTE;
  uStack_28 = in_RAX;
  do {
    if ((((SVar1 & TESS_EVAL) != COMPUTE) && (SVar1 != TESS_EVAL)) && (SVar1 != FRAGMENT)) {
      uStack_28 = CONCAT44(SVar1,(undefined4)uStack_28);
      __position._M_current =
           (this->m_test_cases).
           super__Vector_base<gl4cts::EnhancedLayouts::XFBCaptureUnsizedArrayTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBCaptureUnsizedArrayTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_test_cases).
          super__Vector_base<gl4cts::EnhancedLayouts::XFBCaptureUnsizedArrayTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBCaptureUnsizedArrayTest::testCase>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<gl4cts::EnhancedLayouts::XFBCaptureUnsizedArrayTest::testCase,std::allocator<gl4cts::EnhancedLayouts::XFBCaptureUnsizedArrayTest::testCase>>
        ::_M_realloc_insert<gl4cts::EnhancedLayouts::XFBCaptureUnsizedArrayTest::testCase_const&>
                  ((vector<gl4cts::EnhancedLayouts::XFBCaptureUnsizedArrayTest::testCase,std::allocator<gl4cts::EnhancedLayouts::XFBCaptureUnsizedArrayTest::testCase>>
                    *)&this->m_test_cases,__position,(testCase *)((long)&uStack_28 + 4));
      }
      else {
        (__position._M_current)->m_stage = SVar1;
        (this->m_test_cases).
        super__Vector_base<gl4cts::EnhancedLayouts::XFBCaptureUnsizedArrayTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBCaptureUnsizedArrayTest::testCase>_>
        ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
    }
    SVar1 = SVar1 + VERTEX;
  } while (SVar1 != STAGE_MAX);
  return;
}

Assistant:

void XFBCaptureUnsizedArrayTest::testInit()
{
	for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
	{
		/* Not aplicable for */
		if ((Utils::Shader::COMPUTE == stage) || (Utils::Shader::FRAGMENT == stage) ||
			(Utils::Shader::GEOMETRY == stage) || (Utils::Shader::TESS_EVAL == stage))
		{
			continue;
		}

		testCase test_case = { (Utils::Shader::STAGES)stage };

		m_test_cases.push_back(test_case);
	}
}